

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emplace.cc
# Opt level: O0

void _test<phmap::flat_hash_map<int,custom_type_2,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,custom_type_2>>>,int,custom_type_2,void,_emplace>
               (size_t iterations,size_t container_size,char *map_name)

{
  size_t sVar1;
  ostream *poVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  duration<double,_std::ratio<1L,_1000L>_> local_a0;
  rep local_98;
  rep elapsed;
  time_point t2;
  size_t local_78;
  size_t j;
  flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
  m;
  size_t i;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_30;
  _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
  insert;
  time_point t1;
  size_t count;
  char *map_name_local;
  size_t container_size_local;
  size_t iterations_local;
  
  t1.__d.__r = (duration)0;
  tStack_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (m.
       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
       .
       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
       .settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
            (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
             )(_Head_base<0UL,_unsigned_long,_false>)0x0;
      (ulong)m.
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
             .settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl < iterations;
      m.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
      .settings_.
      super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
      .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
            )((long)m.
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    .settings_.
                    super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 1)) {
    phmap::
    flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
    ::flat_hash_map((flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                     *)&j);
    for (local_78 = 0; local_78 < container_size; local_78 = local_78 + 1) {
      _emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
      ::operator()((_emplace<phmap::flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>,_int,_custom_type_2,_void>
                    *)((long)&i + 7),
                   (flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    *)&j,local_78);
    }
    sVar1 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
            ::size((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                    *)&j);
    t1.__d.__r = (duration)(sVar1 + (long)t1.__d.__r);
    phmap::
    flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
    ::~flat_hash_map((flat_hash_map<int,_custom_type_2,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
                      *)&j);
  }
  elapsed = (rep)std::chrono::_V2::system_clock::now();
  local_a8.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elapsed,&stack0xffffffffffffffd0);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_a0,&local_a8);
  local_98 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_a0);
  if (t1.__d.__r != (duration)(iterations * container_size)) {
    poVar2 = std::operator<<((ostream *)&std::clog,"  invalid count: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)t1.__d.__r);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)&std::clog,map_name);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::fixed);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_98);
  std::operator<<(poVar2," ms\n");
  return;
}

Assistant:

void _test(std::size_t iterations, std::size_t container_size, const char *map_name)
{
    std::size_t count = 0;
    auto t1 = std::chrono::high_resolution_clock::now();
    INSERT<Map, K, V, T> insert;
    for (std::size_t i=0; i<iterations; ++i)
    {
        Map m;
        for (std::size_t j=0; j<container_size; ++j)
            insert(m, j);
        count += m.size();
    }
    auto t2 = std::chrono::high_resolution_clock::now();
    auto elapsed = milliseconds<double>(t2 - t1).count();
    if (count != iterations*container_size)
        std::clog << "  invalid count: " << count << "\n";
    std::clog << map_name << std::fixed << int(elapsed) << " ms\n";
}